

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
DecPOMDPDiscrete::DecPOMDPDiscrete(DecPOMDPDiscrete *this,string *name,string *descr,string *pf)

{
  *(undefined8 *)&this->field_0x220 = 0x5db8b8;
  *(undefined8 *)&this->field_0x228 = 0x5dbb10;
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            (&this->super_MultiAgentDecisionProcessDiscrete,&PTR_construction_vtable_72__005dae68,
             name,descr,pf);
  DecPOMDP::DecPOMDP((DecPOMDP *)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200,
                     &PTR_PTR_005dae90);
  *(undefined8 *)&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess =
       0x5da690;
  *(undefined8 *)&this->field_0x220 = 0x5daa90;
  *(undefined8 *)&this->field_0x228 = 0x5dace8;
  *(undefined8 *)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200 = 0x5da908;
  this->_m_initialized = false;
  this->_m_p_rModel = (RewardModel *)0x0;
  return;
}

Assistant:

DecPOMDPDiscrete::DecPOMDPDiscrete(const string &name,
                                   const string &descr,
                                   const string &pf) :
    MultiAgentDecisionProcessDiscrete(name, descr, pf)
{
    _m_initialized = false;
    _m_p_rModel = 0;
}